

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  long lVar1;
  int iVar2;
  char **ppcVar3;
  VtabCtx *pVVar4;
  sqlite3_vtab *psVar5;
  int iVar6;
  char *p;
  VTable *pVTab;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  Schema **ppSVar11;
  Column *pCVar12;
  short sVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  char *zErr;
  VtabCtx sCtx;
  char *local_48;
  VtabCtx local_40;
  
  ppcVar3 = pTab->azModuleArg;
  iVar2 = pTab->nModuleArg;
  local_48 = (char *)0x0;
  p = sqlite3MPrintf(db,"%s",pTab->zName);
  iVar6 = 7;
  if (p != (char *)0x0) {
    pVTab = (VTable *)sqlite3DbMallocRaw(db,0x30);
    iVar6 = 7;
    if (pVTab != (VTable *)0x0) {
      *(undefined8 *)&pVTab->iSavepoint = 0;
      pVTab->pNext = (VTable *)0x0;
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      pVTab->nRef = 0;
      pVTab->bConstraint = '\0';
      *(undefined3 *)&pVTab->field_0x1d = 0;
      pVTab->db = db;
      pVTab->pMod = pMod;
      if (pTab->pSchema == (Schema *)0x0) {
        uVar19 = 0xfff0bdc0;
      }
      else {
        uVar10 = db->nDb;
        if ((int)uVar10 < 1) {
          uVar19 = 0;
        }
        else {
          ppSVar11 = &db->aDb->pSchema;
          uVar7 = 0;
          do {
            uVar19 = uVar7;
            if (*ppSVar11 == pTab->pSchema) break;
            uVar7 = uVar7 + 1;
            ppSVar11 = ppSVar11 + 4;
            uVar19 = (ulong)uVar10;
          } while (uVar10 != uVar7);
        }
      }
      pTab->azModuleArg[1] = db->aDb[(int)uVar19].zName;
      pVVar4 = db->pVtabCtx;
      db->pVtabCtx = &local_40;
      local_40.pVTable = pVTab;
      local_40.pTab = pTab;
      iVar6 = (*xConstruct)(db,pMod->pAux,iVar2,ppcVar3,&pVTab->pVtab,&local_48);
      db->pVtabCtx = pVVar4;
      if (iVar6 == 0) {
        psVar5 = pVTab->pVtab;
        iVar6 = 0;
        if (psVar5 != (sqlite3_vtab *)0x0) {
          psVar5->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar5->nRef = 0;
          psVar5->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pVTab->nRef = 1;
          if (local_40.pTab == (Table *)0x0) {
            pVTab->pNext = pTab->pVTable;
            pTab->pVTable = pVTab;
            sVar13 = pTab->nCol;
            iVar6 = 0;
            if (0 < sVar13) {
              pCVar12 = pTab->aCol;
              lVar9 = 0;
              do {
                pcVar8 = pCVar12[lVar9].zType;
                if (pcVar8 != (char *)0x0) {
                  uVar19 = 0xffffffffffffffff;
                  uVar10 = 0;
                  do {
                    uVar15 = uVar10;
                    lVar16 = uVar19 + 1;
                    uVar19 = uVar19 + 1;
                    uVar10 = uVar15 + 1;
                  } while (pcVar8[lVar16] != '\0');
                  uVar10 = (uint)uVar19 & 0x3fffffff;
                  lVar16 = 0;
                  do {
                    if (""[(byte)" hidden"[lVar16 + 1]] != ""[(byte)pcVar8[lVar16]])
                    goto LAB_0013c90c;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 6);
                  if ((pcVar8[6] & 0xdfU) == 0) {
LAB_0013c95d:
                    uVar15 = 0;
                  }
                  else {
LAB_0013c90c:
                    if ((uVar19 & 0x3fffffff) == 0) goto LAB_0013c95d;
                    uVar15 = uVar15 & 0x3fffffff;
                    uVar7 = 0;
                    pcVar17 = pcVar8;
                    do {
                      lVar16 = 0;
                      do {
                        if (""[(byte)" hidden"[lVar16]] != ""[(byte)pcVar17[lVar16]])
                        goto LAB_0013c950;
                        lVar16 = lVar16 + 1;
                      } while (lVar16 != 7);
                      if ((pcVar8[uVar7 + 7] & 0xdfU) == 0) {
                        uVar15 = (int)uVar7 + 1;
                        break;
                      }
LAB_0013c950:
                      uVar7 = uVar7 + 1;
                      pcVar17 = pcVar17 + 1;
                    } while (uVar7 != uVar15);
                  }
                  if ((int)uVar15 < (int)uVar10) {
                    lVar16 = (long)(int)uVar15;
                    uVar14 = 7 - (pcVar8[lVar16 + 6] == '\0');
                    if ((int)(uVar15 + uVar14) <= (int)uVar10) {
                      lVar18 = lVar16;
                      do {
                        pcVar8[lVar18] = pcVar8[lVar18 + (ulong)uVar14];
                        lVar1 = (ulong)uVar14 + lVar18;
                        lVar18 = lVar18 + 1;
                      } while (lVar1 + 1U <= (ulong)((uint)uVar19 & 0x3fffffff));
                    }
                    if ((0 < (int)uVar15) && (pcVar8[lVar16] == '\0')) {
                      pcVar8[(ulong)uVar15 - 1] = '\0';
                    }
                    pCVar12 = pTab->aCol;
                    pCVar12[lVar9].colFlags = pCVar12[lVar9].colFlags | 2;
                    sVar13 = pTab->nCol;
                  }
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < sVar13);
              iVar6 = 0;
            }
          }
          else {
            pcVar8 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName);
            *pzErr = pcVar8;
            sqlite3VtabUnlock(pVTab);
            iVar6 = 1;
          }
        }
      }
      else {
        if (iVar6 == 7) {
          db->mallocFailed = '\x01';
        }
        if (local_48 == (char *)0x0) {
          pcVar8 = sqlite3MPrintf(db,"vtable constructor failed: %s",p);
          *pzErr = pcVar8;
        }
        else {
          pcVar8 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar8;
          sqlite3_free(local_48);
        }
        sqlite3DbFree(db,pVTab);
      }
    }
    sqlite3DbFree(db,p);
  }
  return iVar6;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx, *pPriorCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName = sqlite3MPrintf(db, "%s", pTab->zName);
  int iDb;

  if( !zModuleName ){
    return SQLITE_NOMEM;
  }

  pVTable = sqlite3DbMallocZero(db, sizeof(VTable));
  if( !pVTable ){
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  pPriorCtx = db->pVtabCtx;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = pPriorCtx;
  if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.pTab ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = pTab->aCol[iCol].zType;
        int nType;
        int i = 0;
        if( !zType ) continue;
        nType = sqlite3Strlen30(zType);
        if( sqlite3StrNICmp("hidden", zType, 6)||(zType[6] && zType[6]!=' ') ){
          for(i=0; i<nType; i++){
            if( (0==sqlite3StrNICmp(" hidden", &zType[i], 7))
             && (zType[i+7]=='\0' || zType[i+7]==' ')
            ){
              i++;
              break;
            }
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}